

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3DropTable(Parse *pParse,SrcList *pName,int isView,int noErr)

{
  u16 *puVar1;
  uint uVar2;
  sqlite3 *db;
  sqlite3 *psVar3;
  Db *pDVar4;
  Index *pIVar5;
  Schema *pSVar6;
  uint uVar7;
  u8 uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  Table *pTable;
  VTable *pVVar12;
  Vdbe *pVVar13;
  FKey *pFVar14;
  SrcList *pTabList;
  Trigger *pTrigger;
  Parse *pPVar15;
  ExprList *pOrderBy;
  Index **ppIVar16;
  char *pcVar17;
  uint uVar18;
  uint iTable;
  char *zFormat;
  Expr *pLimit;
  HashElem *pHVar19;
  
  db = pParse->db;
  if ((db->mallocFailed != '\0') || (iVar9 = sqlite3ReadSchema(pParse), iVar9 != 0))
  goto LAB_00150b42;
  if (noErr != 0) {
    db->suppressErr = db->suppressErr + '\x01';
  }
  pTable = sqlite3LocateTableItem(pParse,isView,pName->a);
  if (noErr == 0) {
    if (pTable == (Table *)0x0) goto LAB_00150b42;
  }
  else {
    db->suppressErr = db->suppressErr + 0xff;
    if (pTable == (Table *)0x0) {
      sqlite3CodeVerifyNamedSchema(pParse,pName->a[0].zDatabase);
      sqlite3ForceNotReadOnly(pParse);
      goto LAB_00150b42;
    }
  }
  iVar9 = sqlite3SchemaToIndex(db,pTable->pSchema);
  if ((pTable->eTabType == '\x01') &&
     (iVar10 = sqlite3ViewGetColumnNames(pParse,pTable), iVar10 != 0)) goto LAB_00150b42;
  pcVar17 = "sqlite_master";
  if (iVar9 == 1) {
    pcVar17 = "sqlite_temp_master";
  }
  pLimit = (Expr *)db->aDb[iVar9].zDbSName;
  iVar10 = sqlite3AuthCheck(pParse,9,pcVar17,(char *)0x0,(char *)pLimit);
  if (iVar10 != 0) goto LAB_00150b42;
  if (isView == 0) {
    if (pTable->eTabType != '\x01') {
      iVar10 = (uint)(iVar9 == 1) * 2 + 0xb;
      goto LAB_00150c57;
    }
    pVVar12 = sqlite3GetVTable(db,pTable);
    pcVar17 = pVVar12->pMod->zName;
    iVar10 = 0x1e;
  }
  else {
    iVar10 = (uint)(iVar9 != 1) * 2 + 0xf;
LAB_00150c57:
    pcVar17 = (char *)0x0;
  }
  iVar10 = sqlite3AuthCheck(pParse,iVar10,pTable->zName,pcVar17,(char *)pLimit);
  if ((iVar10 != 0) ||
     (iVar10 = sqlite3AuthCheck(pParse,9,pTable->zName,(char *)0x0,(char *)pLimit), iVar10 != 0))
  goto LAB_00150b42;
  pcVar17 = pTable->zName;
  iVar10 = sqlite3_strnicmp(pcVar17,"sqlite_",7);
  if (iVar10 == 0) {
    iVar10 = sqlite3_strnicmp(pcVar17 + 7,"stat",4);
    if (iVar10 != 0) {
      iVar10 = sqlite3_strnicmp(pcVar17 + 7,"parameters",10);
      uVar18 = (uint)(iVar10 != 0);
      goto LAB_00150cfe;
    }
LAB_00150d13:
    if (isView == 0) {
      if (pTable->eTabType != '\x02') goto LAB_00150d4e;
      zFormat = "use DROP VIEW to delete view %s";
    }
    else {
      if (pTable->eTabType == '\x02') {
LAB_00150d4e:
        pVVar13 = sqlite3GetVdbe(pParse);
        if (pVVar13 == (Vdbe *)0x0) goto LAB_00150b42;
        sqlite3BeginWriteOperation(pParse,1,iVar9);
        if (isView == 0) {
          pOrderBy = (ExprList *)pTable->zName;
          sqlite3ClearStatTables(pParse,iVar9,"tbl",(char *)pOrderBy);
          psVar3 = pParse->db;
          if (((psVar3->flags & 0x4000) != 0) && (pTable->eTabType == '\0')) {
            pVVar13 = sqlite3GetVdbe(pParse);
            pFVar14 = sqlite3FkReferences(pTable);
            uVar18 = 0;
            if (pFVar14 == (FKey *)0x0) {
              pFVar14 = (FKey *)&pTable->u;
              do {
                pFVar14 = pFVar14->pNextFrom;
                if (pFVar14 == (FKey *)0x0) goto LAB_00150e96;
              } while ((pFVar14->isDeferred == '\0') && ((psVar3->flags & 0x80000) == 0));
              uVar18 = pParse->nLabel - 1;
              pOrderBy = (ExprList *)(ulong)uVar18;
              pParse->nLabel = uVar18;
              sqlite3VdbeAddOp2(pVVar13,0x30,1,uVar18);
            }
            pParse->disableTriggers = '\x01';
            pTabList = sqlite3SrcListDup(psVar3,pName,0);
            sqlite3DeleteFrom(pParse,pTabList,(Expr *)0x0,pOrderBy,pLimit);
            pParse->disableTriggers = '\0';
            if ((psVar3->flags & 0x80000) == 0) {
              sqlite3VdbeAddOp2(pVVar13,0x30,0,pVVar13->nOp + 2);
              sqlite3HaltConstraint(pParse,0x313,2,(char *)0x0,-1,'\x04');
            }
            if (uVar18 != 0) {
              sqlite3VdbeResolveLabel(pVVar13,uVar18);
            }
          }
        }
LAB_00150e96:
        psVar3 = pParse->db;
        pDVar4 = psVar3->aDb;
        pVVar13 = sqlite3GetVdbe(pParse);
        sqlite3BeginWriteOperation(pParse,1,iVar9);
        if (pTable->eTabType == '\x01') {
          sqlite3VdbeAddOp0(pVVar13,0xaa);
        }
        for (pTrigger = sqlite3TriggerList(pParse,pTable); pTrigger != (Trigger *)0x0;
            pTrigger = pTrigger->pNext) {
          sqlite3DropTriggerPtr(pParse,pTrigger);
        }
        if ((pTable->tabFlags & 8) != 0) {
          sqlite3NestedParse(pParse,"DELETE FROM %Q.sqlite_sequence WHERE name=%Q",
                             pDVar4[iVar9].zDbSName,pTable->zName);
        }
        sqlite3NestedParse(pParse,
                           "DELETE FROM %Q.sqlite_master WHERE tbl_name=%Q and type!=\'trigger\'",
                           pDVar4[iVar9].zDbSName);
        uVar8 = pTable->eTabType;
        if (isView == 0) {
          if (uVar8 != '\x01') {
            uVar18 = pTable->tnum;
            iTable = 0;
            while( true ) {
              uVar11 = iTable - 1;
              ppIVar16 = &pTable->pIndex;
              iTable = uVar18;
              if (uVar11 < uVar18) {
                iTable = 0;
              }
              while (pIVar5 = *ppIVar16, pIVar5 != (Index *)0x0) {
                uVar2 = pIVar5->tnum;
                uVar7 = iTable;
                if (iTable < uVar2) {
                  uVar7 = uVar2;
                }
                if (uVar2 <= uVar11) {
                  iTable = uVar7;
                }
                ppIVar16 = &pIVar5->pNext;
              }
              if (iTable == 0) break;
              iVar10 = sqlite3SchemaToIndex(pParse->db,pTable->pSchema);
              destroyRootPage(pParse,iTable,iVar10);
            }
            uVar8 = pTable->eTabType;
            goto LAB_00150fc1;
          }
LAB_00150fc5:
          sqlite3VdbeAddOp4(pVVar13,0xac,iVar9,0,0,pTable->zName,0);
          pPVar15 = pParse->pToplevel;
          if (pParse->pToplevel == (Parse *)0x0) {
            pPVar15 = pParse;
          }
          pPVar15->mayAbort = '\x01';
        }
        else {
LAB_00150fc1:
          if (uVar8 == '\x01') goto LAB_00150fc5;
        }
        sqlite3VdbeAddOp4(pVVar13,0x97,iVar9,0,0,pTable->zName,0);
        sqlite3ChangeCookie(pParse,iVar9);
        pSVar6 = psVar3->aDb[iVar9].pSchema;
        if ((pSVar6->schemaFlags & 2) != 0) {
          pHVar19 = (HashElem *)&(pSVar6->tblHash).first;
          while (pHVar19 = pHVar19->next, pHVar19 != (HashElem *)0x0) {
            if (((Table *)pHVar19->data)->eTabType == '\x02') {
              sqlite3DeleteColumnNames(psVar3,(Table *)pHVar19->data);
            }
          }
          puVar1 = &(psVar3->aDb[iVar9].pSchema)->schemaFlags;
          *puVar1 = *puVar1 & 0xfffd;
        }
        goto LAB_00150b42;
      }
      zFormat = "use DROP TABLE to delete table %s";
    }
  }
  else {
    uVar18 = pTable->tabFlags;
    if (((uVar18 >> 0xc & 1) == 0) || (iVar10 = sqlite3ReadOnlyShadowTables(db), iVar10 == 0)) {
      uVar18 = uVar18 >> 0xf & 1;
LAB_00150cfe:
      if (uVar18 == 0) goto LAB_00150d13;
    }
    zFormat = "table %s may not be dropped";
  }
  sqlite3ErrorMsg(pParse,zFormat,pcVar17);
LAB_00150b42:
  sqlite3SrcListDelete(db,pName);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DropTable(Parse *pParse, SrcList *pName, int isView, int noErr){
  Table *pTab;
  Vdbe *v;
  sqlite3 *db = pParse->db;
  int iDb;

  if( db->mallocFailed ){
    goto exit_drop_table;
  }
  assert( pParse->nErr==0 );
  assert( pName->nSrc==1 );
  if( sqlite3ReadSchema(pParse) ) goto exit_drop_table;
  if( noErr ) db->suppressErr++;
  assert( isView==0 || isView==LOCATE_VIEW );
  pTab = sqlite3LocateTableItem(pParse, isView, &pName->a[0]);
  if( noErr ) db->suppressErr--;

  if( pTab==0 ){
    if( noErr ){
      sqlite3CodeVerifyNamedSchema(pParse, pName->a[0].zDatabase);
      sqlite3ForceNotReadOnly(pParse);
    }
    goto exit_drop_table;
  }
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb>=0 && iDb<db->nDb );

  /* If pTab is a virtual table, call ViewGetColumnNames() to ensure
  ** it is initialized.
  */
  if( IsVirtual(pTab) && sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto exit_drop_table;
  }
#ifndef SQLITE_OMIT_AUTHORIZATION
  {
    int code;
    const char *zTab = SCHEMA_TABLE(iDb);
    const char *zDb = db->aDb[iDb].zDbSName;
    const char *zArg2 = 0;
    if( sqlite3AuthCheck(pParse, SQLITE_DELETE, zTab, 0, zDb)){
      goto exit_drop_table;
    }
    if( isView ){
      if( !OMIT_TEMPDB && iDb==1 ){
        code = SQLITE_DROP_TEMP_VIEW;
      }else{
        code = SQLITE_DROP_VIEW;
      }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    }else if( IsVirtual(pTab) ){
      code = SQLITE_DROP_VTABLE;
      zArg2 = sqlite3GetVTable(db, pTab)->pMod->zName;
#endif
    }else{
      if( !OMIT_TEMPDB && iDb==1 ){
        code = SQLITE_DROP_TEMP_TABLE;
      }else{
        code = SQLITE_DROP_TABLE;
      }
    }
    if( sqlite3AuthCheck(pParse, code, pTab->zName, zArg2, zDb) ){
      goto exit_drop_table;
    }
    if( sqlite3AuthCheck(pParse, SQLITE_DELETE, pTab->zName, 0, zDb) ){
      goto exit_drop_table;
    }
  }
#endif
  if( tableMayNotBeDropped(db, pTab) ){
    sqlite3ErrorMsg(pParse, "table %s may not be dropped", pTab->zName);
    goto exit_drop_table;
  }

#ifndef SQLITE_OMIT_VIEW
  /* Ensure DROP TABLE is not used on a view, and DROP VIEW is not used
  ** on a table.
  */
  if( isView && !IsView(pTab) ){
    sqlite3ErrorMsg(pParse, "use DROP TABLE to delete table %s", pTab->zName);
    goto exit_drop_table;
  }
  if( !isView && IsView(pTab) ){
    sqlite3ErrorMsg(pParse, "use DROP VIEW to delete view %s", pTab->zName);
    goto exit_drop_table;
  }
#endif

  /* Generate code to remove the table from the schema table
  ** on disk.
  */
  v = sqlite3GetVdbe(pParse);
  if( v ){
    sqlite3BeginWriteOperation(pParse, 1, iDb);
    if( !isView ){
      sqlite3ClearStatTables(pParse, iDb, "tbl", pTab->zName);
      sqlite3FkDropTable(pParse, pName, pTab);
    }
    sqlite3CodeDropTable(pParse, pTab, iDb, isView);
  }

exit_drop_table:
  sqlite3SrcListDelete(db, pName);
}